

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_nil(FuncState *fs,int from,int n)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (fs->lasttarget < fs->pc) {
    puVar2 = fs->f->code + (long)fs->pc + -1;
  }
  else {
    puVar2 = &previousinstruction_invalidinstruction;
  }
  uVar1 = *puVar2;
  if ((uVar1 & 0x7f) == 8) {
    uVar5 = uVar1 >> 7 & 0xff;
    uVar3 = uVar1 >> 0x10 & 0xff;
    if ((from <= (int)(uVar5 + uVar3 + 1) && (int)uVar5 <= from) ||
       ((int)uVar5 <= n + from && from <= (int)uVar5)) {
      iVar4 = uVar3 + uVar5;
      uVar3 = from;
      if ((int)uVar5 < from) {
        uVar3 = uVar5;
      }
      if (iVar4 < n + from) {
        iVar4 = n + from + 0xff;
      }
      *puVar2 = (iVar4 - uVar3 & 0xff) << 0x10 | (uVar3 & 0xff) << 7 | uVar1 & 0xff008008;
      return;
    }
  }
  luaK_code(fs,n * 0x10000 - 0x10000U | from << 7 | 8);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  int l = from + n - 1;  /* last register to set nil */
  Instruction *previous = previousinstruction(fs);
  if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
    int pfrom = GETARG_A(*previous);  /* get previous range */
    int pl = pfrom + GETARG_B(*previous);
    if ((pfrom <= from && from <= pl + 1) ||
        (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
      if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
      if (pl > l) l = pl;  /* l = max(l, pl) */
      SETARG_A(*previous, from);
      SETARG_B(*previous, l - from);
      return;
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}